

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmEndIfCommand.cxx
# Opt level: O2

bool __thiscall
cmEndIfCommand::InitialPass
          (cmEndIfCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *param_1,cmExecutionStatus *param_2)

{
  cmMakefile *this_00;
  char *__nptr;
  bool bVar1;
  double dVar2;
  allocator local_39;
  string local_38;
  
  this_00 = (this->super_cmCommand).Makefile;
  std::__cxx11::string::string((string *)&local_38,"CMAKE_MINIMUM_REQUIRED_VERSION",&local_39);
  __nptr = cmMakefile::GetDefinition(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  bVar1 = true;
  if (__nptr != (char *)0x0) {
    dVar2 = atof(__nptr);
    if (1.4 < dVar2) {
      std::__cxx11::string::string
                ((string *)&local_38,
                 "An ENDIF command was found outside of a proper IF ENDIF structure. Or its arguments did not match the opening IF command."
                 ,&local_39);
      cmCommand::SetError(&this->super_cmCommand,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool cmEndIfCommand::InitialPass(std::vector<std::string> const&,
                                 cmExecutionStatus &)
{
  const char* versionValue
    = this->Makefile->GetDefinition("CMAKE_MINIMUM_REQUIRED_VERSION");
  if (!versionValue || (atof(versionValue) <= 1.4))
    {
    return true;
    }

  this->SetError("An ENDIF command was found outside of a proper "
                 "IF ENDIF structure. Or its arguments did not match "
                 "the opening IF command.");
  return false;
}